

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xpath_ast_node * __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_step(xpath_parser *this,xpath_ast_node *set)

{
  nodetest_t test;
  bool bVar1;
  xpath_value_type xVar2;
  lexeme_t lVar3;
  xpath_lexer_string *pxVar4;
  xpath_ast_node *this_00;
  char_t *contents;
  xpath_ast_node *pxVar5;
  xpath_ast_node *this_01;
  xpath_ast_node *pred;
  xpath_ast_node *expr;
  xpath_ast_node *last;
  xpath_ast_node *n;
  char_t *local_58;
  xpath_lexer_string local_50;
  undefined1 local_40 [8];
  xpath_lexer_string nt_name;
  axis_t local_28;
  nodetest_t nt_type;
  axis_t axis;
  bool axis_specified;
  xpath_ast_node *set_local;
  xpath_parser *this_local;
  
  _axis = set;
  set_local = (xpath_ast_node *)this;
  if ((set != (xpath_ast_node *)0x0) &&
     (xVar2 = xpath_ast_node::rettype(set), xVar2 != xpath_type_node_set)) {
    throw_error(this,"Step has to be applied to node set");
  }
  nt_type._3_1_ = nodetest_none >> 0x18;
  local_28 = axis_child;
  lVar3 = xpath_lexer::current(&this->_lexer);
  if (lVar3 == lex_axis_attribute) {
    local_28 = axis_attribute;
    nt_type._3_1_ = 1;
    xpath_lexer::next(&this->_lexer);
  }
  else {
    lVar3 = xpath_lexer::current(&this->_lexer);
    if (lVar3 == lex_dot) {
      xpath_lexer::next(&this->_lexer);
      pxVar5 = (xpath_ast_node *)alloc_node(this);
      xpath_ast_node::xpath_ast_node
                (pxVar5,ast_step,_axis,axis_self,nodetest_type_node,(char_t *)0x0);
      return pxVar5;
    }
    lVar3 = xpath_lexer::current(&this->_lexer);
    if (lVar3 == lex_double_dot) {
      xpath_lexer::next(&this->_lexer);
      pxVar5 = (xpath_ast_node *)alloc_node(this);
      xpath_ast_node::xpath_ast_node
                (pxVar5,ast_step,_axis,axis_parent,nodetest_type_node,(char_t *)0x0);
      return pxVar5;
    }
  }
  nt_name.end._4_4_ = nodetest_none;
  xpath_lexer_string::xpath_lexer_string((xpath_lexer_string *)local_40);
  lVar3 = xpath_lexer::current(&this->_lexer);
  if (lVar3 == lex_string) {
    pxVar4 = xpath_lexer::contents(&this->_lexer);
    local_40 = (undefined1  [8])pxVar4->begin;
    nt_name.begin = pxVar4->end;
    xpath_lexer::next(&this->_lexer);
    lVar3 = xpath_lexer::current(&this->_lexer);
    if (lVar3 == lex_double_colon) {
      if ((nt_type._3_1_ & 1) != nodetest_none >> 0x18) {
        throw_error(this,"Two axis specifiers in one step");
      }
      local_28 = parse_axis_name(this,(xpath_lexer_string *)local_40,(bool *)((long)&nt_type + 3));
      if ((nt_type._3_1_ & 1) == nodetest_none >> 0x18) {
        throw_error(this,"Unknown axis");
      }
      xpath_lexer::next(&this->_lexer);
      lVar3 = xpath_lexer::current(&this->_lexer);
      if (lVar3 == lex_multiply) {
        nt_name.end._4_4_ = nodetest_all;
        xpath_lexer_string::xpath_lexer_string(&local_50);
        local_40 = (undefined1  [8])local_50.begin;
        nt_name.begin = local_50.end;
        xpath_lexer::next(&this->_lexer);
      }
      else {
        lVar3 = xpath_lexer::current(&this->_lexer);
        if (lVar3 == lex_string) {
          pxVar4 = xpath_lexer::contents(&this->_lexer);
          local_40 = (undefined1  [8])pxVar4->begin;
          nt_name.begin = pxVar4->end;
          xpath_lexer::next(&this->_lexer);
        }
        else {
          throw_error(this,"Unrecognized node test");
        }
      }
    }
    if (nt_name.end._4_4_ == nodetest_none) {
      lVar3 = xpath_lexer::current(&this->_lexer);
      if (lVar3 == lex_open_brace) {
        xpath_lexer::next(&this->_lexer);
        lVar3 = xpath_lexer::current(&this->_lexer);
        if (lVar3 == lex_close_brace) {
          xpath_lexer::next(&this->_lexer);
          nt_name.end._4_4_ = parse_node_test_type(this,(xpath_lexer_string *)local_40);
          if (nt_name.end._4_4_ == nodetest_none) {
            throw_error(this,"Unrecognized node type");
          }
          xpath_lexer_string::xpath_lexer_string((xpath_lexer_string *)&n);
          local_40 = (undefined1  [8])n;
          nt_name.begin = local_58;
        }
        else {
          bVar1 = xpath_lexer_string::operator==
                            ((xpath_lexer_string *)local_40,"processing-instruction");
          if (bVar1) {
            lVar3 = xpath_lexer::current(&this->_lexer);
            if (lVar3 != lex_quoted_string) {
              throw_error(this,"Only literals are allowed as arguments to processing-instruction()")
              ;
            }
            nt_name.end._4_4_ = nodetest_pi;
            pxVar4 = xpath_lexer::contents(&this->_lexer);
            local_40 = (undefined1  [8])pxVar4->begin;
            nt_name.begin = pxVar4->end;
            xpath_lexer::next(&this->_lexer);
            lVar3 = xpath_lexer::current(&this->_lexer);
            if (lVar3 != lex_close_brace) {
              throw_error(this,"Unmatched brace near processing-instruction()");
            }
            xpath_lexer::next(&this->_lexer);
          }
          else {
            throw_error(this,"Unmatched brace near node type test");
          }
        }
      }
      else if ((((long)nt_name.begin - (long)local_40 < 3) || (nt_name.begin[-2] != ':')) ||
              (nt_name.begin[-1] != '*')) {
        nt_name.end._4_4_ = nodetest_name;
      }
      else {
        nt_name.begin = nt_name.begin + -1;
        nt_name.end._4_4_ = nodetest_all_in_namespace;
      }
    }
  }
  else {
    lVar3 = xpath_lexer::current(&this->_lexer);
    if (lVar3 == lex_multiply) {
      nt_name.end._4_4_ = nodetest_all;
      xpath_lexer::next(&this->_lexer);
    }
    else {
      throw_error(this,"Unrecognized node test");
    }
  }
  this_00 = (xpath_ast_node *)alloc_node(this);
  pxVar5 = _axis;
  test = nt_name.end._4_4_;
  contents = alloc_string(this,(xpath_lexer_string *)local_40);
  xpath_ast_node::xpath_ast_node(this_00,ast_step,pxVar5,local_28,test,contents);
  expr = (xpath_ast_node *)0x0;
  while (lVar3 = xpath_lexer::current(&this->_lexer), lVar3 == lex_open_square_brace) {
    xpath_lexer::next(&this->_lexer);
    pxVar5 = parse_expression(this);
    this_01 = (xpath_ast_node *)alloc_node(this);
    xpath_ast_node::xpath_ast_node
              (this_01,ast_predicate,xpath_type_node_set,pxVar5,(xpath_ast_node *)0x0);
    lVar3 = xpath_lexer::current(&this->_lexer);
    if (lVar3 != lex_close_square_brace) {
      throw_error(this,"Unmatched square brace");
    }
    xpath_lexer::next(&this->_lexer);
    if (expr == (xpath_ast_node *)0x0) {
      xpath_ast_node::set_right(this_00,this_01);
      expr = this_01;
    }
    else {
      xpath_ast_node::set_next(expr,this_01);
      expr = this_01;
    }
  }
  return this_00;
}

Assistant:

xpath_ast_node* parse_step(xpath_ast_node* set)
		{
			if (set && set->rettype() != xpath_type_node_set)
				throw_error("Step has to be applied to node set");

			bool axis_specified = false;
			axis_t axis = axis_child; // implied child axis

			if (_lexer.current() == lex_axis_attribute)
			{
				axis = axis_attribute;
				axis_specified = true;
				
				_lexer.next();
			}
			else if (_lexer.current() == lex_dot)
			{
				_lexer.next();
				
				return new (alloc_node()) xpath_ast_node(ast_step, set, axis_self, nodetest_type_node, 0);
			}
			else if (_lexer.current() == lex_double_dot)
			{
				_lexer.next();
				
				return new (alloc_node()) xpath_ast_node(ast_step, set, axis_parent, nodetest_type_node, 0);
			}
		
			nodetest_t nt_type = nodetest_none;
			xpath_lexer_string nt_name;
			
			if (_lexer.current() == lex_string)
			{
				// node name test
				nt_name = _lexer.contents();
				_lexer.next();

				// was it an axis name?
				if (_lexer.current() == lex_double_colon)
				{
					// parse axis name
					if (axis_specified) throw_error("Two axis specifiers in one step");

					axis = parse_axis_name(nt_name, axis_specified);

					if (!axis_specified) throw_error("Unknown axis");

					// read actual node test
					_lexer.next();

					if (_lexer.current() == lex_multiply)
					{
						nt_type = nodetest_all;
						nt_name = xpath_lexer_string();
						_lexer.next();
					}
					else if (_lexer.current() == lex_string)
					{
						nt_name = _lexer.contents();
						_lexer.next();
					}
					else throw_error("Unrecognized node test");
				}
				
				if (nt_type == nodetest_none)
				{
					// node type test or processing-instruction
					if (_lexer.current() == lex_open_brace)
					{
						_lexer.next();
						
						if (_lexer.current() == lex_close_brace)
						{
							_lexer.next();

							nt_type = parse_node_test_type(nt_name);

							if (nt_type == nodetest_none) throw_error("Unrecognized node type");
							
							nt_name = xpath_lexer_string();
						}
						else if (nt_name == PUGIXML_TEXT("processing-instruction"))
						{
							if (_lexer.current() != lex_quoted_string)
								throw_error("Only literals are allowed as arguments to processing-instruction()");
						
							nt_type = nodetest_pi;
							nt_name = _lexer.contents();
							_lexer.next();
							
							if (_lexer.current() != lex_close_brace)
								throw_error("Unmatched brace near processing-instruction()");
							_lexer.next();
						}
						else
							throw_error("Unmatched brace near node type test");

					}
					// QName or NCName:*
					else
					{
						if (nt_name.end - nt_name.begin > 2 && nt_name.end[-2] == ':' && nt_name.end[-1] == '*') // NCName:*
						{
							nt_name.end--; // erase *
							
							nt_type = nodetest_all_in_namespace;
						}
						else nt_type = nodetest_name;
					}
				}
			}
			else if (_lexer.current() == lex_multiply)
			{
				nt_type = nodetest_all;
				_lexer.next();
			}
			else throw_error("Unrecognized node test");
			
			xpath_ast_node* n = new (alloc_node()) xpath_ast_node(ast_step, set, axis, nt_type, alloc_string(nt_name));
			
			xpath_ast_node* last = 0;
			
			while (_lexer.current() == lex_open_square_brace)
			{
				_lexer.next();
				
				xpath_ast_node* expr = parse_expression();

				xpath_ast_node* pred = new (alloc_node()) xpath_ast_node(ast_predicate, xpath_type_node_set, expr);
				
				if (_lexer.current() != lex_close_square_brace)
					throw_error("Unmatched square brace");
				_lexer.next();
				
				if (last) last->set_next(pred);
				else n->set_right(pred);
				
				last = pred;
			}
			
			return n;
		}